

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O2

int cornerstone::buffer::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint uVar1;
  buffer *this;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *(uint *)src;
  uVar3 = 0x7fffffff;
  if (-1 < (int)uVar1) {
    uVar3 = 0xffff;
  }
  if ((int)uVar1 < 0) {
    uVar2 = *(uint *)(src + 4);
  }
  else {
    uVar2 = uVar1 >> 0x10;
  }
  alloc((buffer *)dst,(ulong)(uVar3 & uVar1) - (ulong)uVar2);
  this = *(buffer **)(dst + 8);
  put(this,(buffer *)src);
  if (*(int *)this < 0) {
    *(undefined4 *)(this + 4) = 0;
  }
  else {
    *(undefined2 *)(this + 2) = 0;
  }
  return (int)dst;
}

Assistant:

bufptr buffer::copy(const buffer& buf)
{
    bufptr other = alloc(buf.size() - buf.pos());
    other->put(buf);
    other->pos(0);
    return other;
}